

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_shard.c
# Opt level: O2

REF_STATUS ref_shard_add_hex_as_tet(REF_NODE ref_node,REF_CELL ref_cell,REF_INT *nodes)

{
  int iVar1;
  uint uVar2;
  long lVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  REF_STATUS RVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  long lVar15;
  uint uVar16;
  long lVar17;
  uint uVar18;
  char cVar19;
  long lVar20;
  char cVar21;
  long lVar22;
  undefined1 uVar23;
  bool bVar24;
  REF_GLOB global [27];
  uint uVar3;
  
  lVar12 = -1;
  for (lVar9 = 0; lVar9 != 8; lVar9 = lVar9 + 1) {
    iVar1 = nodes[lVar9];
    lVar17 = lVar12;
    if (((-1 < (long)iVar1) && (iVar1 < ref_node->max)) &&
       (lVar17 = ref_node->global[iVar1], ref_node->global[iVar1] < 0)) {
      lVar17 = lVar12;
    }
    global[lVar9] = lVar17;
  }
  if (global[1] <= global[0]) {
    global[0] = global[1];
  }
  lVar12 = global[3];
  if (global[2] < global[3]) {
    lVar12 = global[2];
  }
  if (global[0] < lVar12) {
    lVar12 = global[0];
  }
  lVar9 = global[5];
  if (global[4] < global[5]) {
    lVar9 = global[4];
  }
  if (lVar12 <= lVar9) {
    lVar9 = lVar12;
  }
  lVar12 = global[7];
  if (global[6] < global[7]) {
    lVar12 = global[6];
  }
  if (lVar9 <= lVar12) {
    lVar12 = lVar9;
  }
  bVar24 = global[1] != lVar12;
  if (bVar24) {
    uVar16 = 2;
    uVar14 = 3;
    uVar11 = 4;
    uVar10 = 5;
    lVar9 = 6;
    uVar7 = 7;
  }
  else {
    uVar16 = 4;
    uVar14 = 5;
    uVar11 = 2;
    uVar10 = 3;
    lVar9 = 7;
    uVar7 = 6;
  }
  uVar18 = (uint)bVar24;
  uVar23 = !bVar24;
  if (global[2] == lVar12) {
    uVar23 = 2;
    uVar18 = 1;
    uVar16 = 5;
    uVar14 = 6;
    uVar11 = 3;
    uVar10 = 0;
    lVar9 = 4;
    uVar7 = 7;
  }
  if (global[3] == lVar12) {
    uVar23 = 3;
    uVar18 = 0;
    uVar16 = 1;
    uVar14 = 2;
    uVar11 = 7;
    uVar10 = 4;
    lVar9 = 5;
    uVar7 = 6;
  }
  if (global[4] == lVar12) {
    lVar9 = 2;
    uVar23 = 4;
    uVar18 = 0;
    uVar16 = 3;
    uVar14 = 7;
    uVar11 = 5;
    uVar10 = 1;
    uVar7 = 6;
  }
  if (global[5] == lVar12) {
    lVar9 = 3;
    uVar23 = 5;
    uVar18 = 1;
    uVar16 = 0;
    uVar14 = 4;
    uVar11 = 6;
    uVar10 = 2;
    uVar7 = 7;
  }
  if (global[6] == lVar12) {
    uVar23 = 6;
    uVar18 = 2;
    uVar16 = 1;
    uVar14 = 5;
    uVar11 = 7;
    uVar10 = 3;
    uVar7 = 4;
    lVar9 = 0;
  }
  if (global[7] == lVar12) {
    lVar9 = 1;
    uVar23 = 7;
    uVar14 = 6;
    uVar18 = 3;
    uVar16 = 2;
    uVar11 = 4;
    uVar10 = 0;
    uVar7 = 5;
  }
  lVar12 = global[lVar9];
  lVar9 = global[uVar18];
  if (lVar12 <= global[uVar18]) {
    lVar9 = lVar12;
  }
  lVar17 = global[uVar16];
  lVar4 = global[uVar10];
  lVar22 = lVar4;
  if (lVar17 < lVar4) {
    lVar22 = lVar17;
  }
  lVar15 = global[uVar14];
  if (lVar12 <= global[uVar14]) {
    lVar15 = lVar12;
  }
  lVar20 = global[uVar7];
  if (lVar20 <= lVar17) {
    lVar17 = lVar20;
  }
  if (global[uVar11] < lVar12) {
    lVar12 = global[uVar11];
  }
  if (lVar4 < lVar20) {
    lVar20 = lVar4;
  }
  cVar19 = '\0';
  if (lVar12 < lVar20) {
    cVar19 = 'x';
  }
  bVar24 = lVar15 < lVar17;
  if (lVar15 < lVar17) {
    cVar19 = '\0';
  }
  bVar5 = lVar9 < lVar22;
  if (lVar9 < lVar22) {
    cVar19 = '\0';
  }
  cVar21 = -0x10;
  if (lVar12 < lVar20) {
    cVar21 = cVar19;
  }
  bVar6 = lVar17 <= lVar15 && bVar5;
  if (lVar12 < lVar20) {
    bVar6 = lVar22 <= lVar9 && bVar24;
  }
  if (lVar22 > lVar9 || !bVar24) {
    cVar21 = cVar19;
  }
  if (bVar6) {
    cVar21 = '\0';
  }
  cVar19 = -0x10;
  if (lVar20 <= lVar12) {
    cVar19 = cVar21;
  }
  if (lVar17 > lVar15 || !bVar5) {
    cVar19 = cVar21;
  }
  cVar21 = 'x';
  if (lVar12 < lVar20) {
    cVar21 = cVar19;
  }
  if (!bVar5 || !bVar24) {
    cVar21 = cVar19;
  }
  cVar19 = '\0';
  if (lVar20 <= lVar12) {
    cVar19 = cVar21;
  }
  if (!bVar5 || !bVar24) {
    cVar19 = cVar21;
  }
  uVar2 = uVar18;
  uVar3 = uVar11;
  if (cVar19 != -0x10) {
    if (cVar19 == 'x') {
      RVar8 = (*(code *)(&DAT_00213478 +
                        *(int *)(&DAT_00213478 +
                                (ulong)((uint)bVar24 + (uint)bVar5 + (uint)(lVar12 < lVar20)) * 4)))
                        (uVar14,uVar7,
                         &DAT_00213478 +
                         *(int *)(&DAT_00213478 +
                                 (ulong)((uint)bVar24 + (uint)bVar5 + (uint)(lVar12 < lVar20)) * 4),
                         uVar10,uVar16,uVar18,uVar23,uVar11,uVar11);
      return RVar8;
    }
    uVar10 = (ulong)uVar7;
    uVar2 = uVar11;
    uVar3 = uVar14;
    uVar14 = uVar18;
  }
  uVar13 = (ulong)((uint)bVar24 + (uint)bVar5 + (uint)(lVar12 < lVar20));
  RVar8 = (*(code *)(&DAT_00213478 + *(int *)(&DAT_00213478 + uVar13 * 4)))
                    (uVar2,bVar5,uVar13,&DAT_00213478 + *(int *)(&DAT_00213478 + uVar13 * 4),uVar10,
                     uVar3,uVar23,uVar11,uVar14);
  return RVar8;
}

Assistant:

REF_FCN static REF_STATUS ref_shard_add_hex_as_tet(REF_NODE ref_node,
                                                   REF_CELL ref_cell,
                                                   REF_INT *nodes) {
  REF_INT node;
  REF_GLOB minnode, global[REF_CELL_MAX_SIZE_PER];
  REF_INT I[REF_CELL_MAX_SIZE_PER];
  REF_INT face0, face1, face2, deg, n;
  REF_INT tet_nodes[REF_CELL_MAX_SIZE_PER];

  for (node = 0; node < 8; node++)
    global[node] = ref_node_global(ref_node, nodes[node]);

  /* permutaion with node 0 the smallest global index of the hex */

  minnode = MIN(MIN(global[0], global[1]), MIN(global[2], global[3]));
  minnode = MIN(MIN(global[4], global[5]), minnode);
  minnode = MIN(MIN(global[6], global[7]), minnode);

  I[0] = 0;
  I[1] = 1;
  I[2] = 2;
  I[3] = 3;
  I[4] = 4;
  I[5] = 5;
  I[6] = 6;
  I[7] = 7;
  if (global[1] == minnode) {
    I[0] = 1;
    I[1] = 0;
    I[2] = 4;
    I[3] = 5;
    I[4] = 2;
    I[5] = 3;
    I[6] = 7;
    I[7] = 6;
  }
  if (global[2] == minnode) {
    I[0] = 2;
    I[1] = 1;
    I[2] = 5;
    I[3] = 6;
    I[4] = 3;
    I[5] = 0;
    I[6] = 4;
    I[7] = 7;
  }
  if (global[3] == minnode) {
    I[0] = 3;
    I[1] = 0;
    I[2] = 1;
    I[3] = 2;
    I[4] = 7;
    I[5] = 4;
    I[6] = 5;
    I[7] = 6;
  }
  if (global[4] == minnode) {
    I[0] = 4;
    I[1] = 0;
    I[2] = 3;
    I[3] = 7;
    I[4] = 5;
    I[5] = 1;
    I[6] = 2;
    I[7] = 6;
  }
  if (global[5] == minnode) {
    I[0] = 5;
    I[1] = 1;
    I[2] = 0;
    I[3] = 4;
    I[4] = 6;
    I[5] = 2;
    I[6] = 3;
    I[7] = 7;
  }
  if (global[6] == minnode) {
    I[0] = 6;
    I[1] = 2;
    I[2] = 1;
    I[3] = 5;
    I[4] = 7;
    I[5] = 3;
    I[6] = 0;
    I[7] = 4;
  }
  if (global[7] == minnode) {
    I[0] = 7;
    I[1] = 3;
    I[2] = 2;
    I[3] = 6;
    I[4] = 4;
    I[5] = 0;
    I[6] = 1;
    I[7] = 5;
  }

  /* find the faces with diag toward I[7]*/
  face0 = MIN(global[I[1]], global[I[6]]) < MIN(global[I[2]], global[I[5]]);
  face1 = MIN(global[I[3]], global[I[6]]) < MIN(global[I[2]], global[I[7]]);
  face2 = MIN(global[I[4]], global[I[6]]) < MIN(global[I[5]], global[I[7]]);
  deg = 0; /* table 5 */
  if (0 == face0 && 0 == face1 && 0 == face2) deg = 0;
  if (0 == face0 && 0 == face1 && 1 == face2) deg = 120;
  if (0 == face0 && 1 == face1 && 0 == face2) deg = 240;
  if (0 == face0 && 1 == face1 && 1 == face2) deg = 0;
  if (1 == face0 && 0 == face1 && 0 == face2) deg = 0;
  if (1 == face0 && 0 == face1 && 1 == face2) deg = 240;
  if (1 == face0 && 1 == face1 && 0 == face2) deg = 120;
  if (1 == face0 && 1 == face1 && 1 == face2) deg = 0;
  if (120 == deg) {
    ref_shard_permute_hex_120(I);
  }
  if (240 == deg) {
    ref_shard_permute_hex_120(I);
    ref_shard_permute_hex_120(I);
  }

  n = face0 + face1 + face2;

  switch (n) {
    case 0:
      tet_nodes[0] = nodes[I[0]];
      tet_nodes[1] = nodes[I[1]];
      tet_nodes[2] = nodes[I[2]];
      tet_nodes[3] = nodes[I[5]];
      RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
      tet_nodes[0] = nodes[I[0]];
      tet_nodes[1] = nodes[I[2]];
      tet_nodes[2] = nodes[I[7]];
      tet_nodes[3] = nodes[I[5]];
      RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
      tet_nodes[0] = nodes[I[0]];
      tet_nodes[1] = nodes[I[2]];
      tet_nodes[2] = nodes[I[3]];
      tet_nodes[3] = nodes[I[7]];
      RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
      tet_nodes[0] = nodes[I[0]];
      tet_nodes[1] = nodes[I[5]];
      tet_nodes[2] = nodes[I[7]];
      tet_nodes[3] = nodes[I[4]];
      RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
      tet_nodes[0] = nodes[I[2]];
      tet_nodes[1] = nodes[I[7]];
      tet_nodes[2] = nodes[I[5]];
      tet_nodes[3] = nodes[I[6]];
      RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
      /* n=0 has 5 tets */
      break;
    case 1:
      tet_nodes[0] = nodes[I[0]];
      tet_nodes[1] = nodes[I[5]];
      tet_nodes[2] = nodes[I[7]];
      tet_nodes[3] = nodes[I[4]];
      RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
      tet_nodes[0] = nodes[I[0]];
      tet_nodes[1] = nodes[I[1]];
      tet_nodes[2] = nodes[I[7]];
      tet_nodes[3] = nodes[I[5]];
      RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
      tet_nodes[0] = nodes[I[1]];
      tet_nodes[1] = nodes[I[6]];
      tet_nodes[2] = nodes[I[7]];
      tet_nodes[3] = nodes[I[5]];
      RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
      tet_nodes[0] = nodes[I[0]];
      tet_nodes[1] = nodes[I[7]];
      tet_nodes[2] = nodes[I[2]];
      tet_nodes[3] = nodes[I[3]];
      RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
      tet_nodes[0] = nodes[I[0]];
      tet_nodes[1] = nodes[I[7]];
      tet_nodes[2] = nodes[I[1]];
      tet_nodes[3] = nodes[I[2]];
      RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
      tet_nodes[0] = nodes[I[1]];
      tet_nodes[1] = nodes[I[7]];
      tet_nodes[2] = nodes[I[6]];
      tet_nodes[3] = nodes[I[2]];
      RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
      break;
    case 2:
      tet_nodes[0] = nodes[I[0]];
      tet_nodes[1] = nodes[I[4]];
      tet_nodes[2] = nodes[I[5]];
      tet_nodes[3] = nodes[I[6]];
      RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
      tet_nodes[0] = nodes[I[0]];
      tet_nodes[1] = nodes[I[3]];
      tet_nodes[2] = nodes[I[7]];
      tet_nodes[3] = nodes[I[6]];
      RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
      tet_nodes[0] = nodes[I[0]];
      tet_nodes[1] = nodes[I[7]];
      tet_nodes[2] = nodes[I[4]];
      tet_nodes[3] = nodes[I[6]];
      RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
      tet_nodes[0] = nodes[I[0]];
      tet_nodes[1] = nodes[I[1]];
      tet_nodes[2] = nodes[I[2]];
      tet_nodes[3] = nodes[I[5]];
      RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
      tet_nodes[0] = nodes[I[0]];
      tet_nodes[1] = nodes[I[3]];
      tet_nodes[2] = nodes[I[6]];
      tet_nodes[3] = nodes[I[2]];
      RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
      tet_nodes[0] = nodes[I[0]];
      tet_nodes[1] = nodes[I[6]];
      tet_nodes[2] = nodes[I[5]];
      tet_nodes[3] = nodes[I[2]];
      RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
      break;
    case 3:
      tet_nodes[0] = nodes[I[0]];
      tet_nodes[1] = nodes[I[2]];
      tet_nodes[2] = nodes[I[3]];
      tet_nodes[3] = nodes[I[6]];
      RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
      tet_nodes[0] = nodes[I[0]];
      tet_nodes[1] = nodes[I[3]];
      tet_nodes[2] = nodes[I[7]];
      tet_nodes[3] = nodes[I[6]];
      RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
      tet_nodes[0] = nodes[I[0]];
      tet_nodes[1] = nodes[I[7]];
      tet_nodes[2] = nodes[I[4]];
      tet_nodes[3] = nodes[I[6]];
      RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
      tet_nodes[0] = nodes[I[0]];
      tet_nodes[1] = nodes[I[5]];
      tet_nodes[2] = nodes[I[6]];
      tet_nodes[3] = nodes[I[4]];
      RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
      tet_nodes[0] = nodes[I[1]];
      tet_nodes[1] = nodes[I[5]];
      tet_nodes[2] = nodes[I[6]];
      tet_nodes[3] = nodes[I[0]];
      RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
      tet_nodes[0] = nodes[I[1]];
      tet_nodes[1] = nodes[I[6]];
      tet_nodes[2] = nodes[I[2]];
      tet_nodes[3] = nodes[I[0]];
      RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
      break;
    default:
      RSB(REF_IMPLEMENT, "should be 0-3", printf("n %d\n", n););
      break;
  }

  return REF_SUCCESS;
}